

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

QString * architectureFromName(QString *name)

{
  ulong uVar1;
  undefined8 in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  QRegularExpressionMatch match;
  QRegularExpression architecture;
  undefined4 in_stack_ffffffffffffff58;
  MatchOption in_stack_ffffffffffffff5c;
  int iVar2;
  QArrayDataPointer<char16_t> *this;
  undefined4 local_54;
  undefined8 local_50;
  uint local_44;
  QArrayDataPointer<char16_t> local_40;
  undefined1 local_28 [24];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this = in_RDI;
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (&local_40,(Data *)0x0,L"_(armeabi-v7a|arm64-v8a|x86|x86_64).so$",0x27);
  QString::QString((QString *)this,
                   (DataPointer *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  QFlags<QRegularExpression::PatternOption>::QFlags
            ((QFlags<QRegularExpression::PatternOption> *)this,in_stack_ffffffffffffff5c);
  QRegularExpression::QRegularExpression
            ((QRegularExpression *)&local_10,(QString *)local_28,(QFlags *)(ulong)local_44);
  QString::~QString((QString *)0x10961e);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this);
  local_50 = 0xaaaaaaaaaaaaaaaa;
  QFlags<QRegularExpression::MatchOption>::QFlags
            ((QFlags<QRegularExpression::MatchOption> *)this,in_stack_ffffffffffffff5c);
  iVar2 = (int)this;
  QRegularExpression::match(&local_50,&local_10,in_RSI,0,0,local_54);
  uVar1 = QRegularExpressionMatch::hasMatch();
  if ((uVar1 & 1) == 0) {
    QString::QString((QString *)0x109685);
  }
  else {
    QRegularExpressionMatch::captured(iVar2);
  }
  QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_50);
  QRegularExpression::~QRegularExpression((QRegularExpression *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString architectureFromName(const QString &name)
{
    QRegularExpression architecture(QStringLiteral("_(armeabi-v7a|arm64-v8a|x86|x86_64).so$"));
    auto match = architecture.match(name);
    if (!match.hasMatch())
        return {};
    return match.captured(1);
}